

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

ParamGenerator<unsigned_long_long> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  unsigned_long_long *in_RSI;
  ParamGenerator<unsigned_long_long> PVar2;
  initializer_list<unsigned_long_long> __l;
  allocator_type local_51;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_50;
  unsigned_long_long local_38;
  unsigned_long_long uStack_30;
  unsigned_long_long local_28;
  unsigned_long_long uStack_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_38 = *in_RSI;
  uStack_30 = in_RSI[1];
  local_28 = in_RSI[2];
  uStack_20 = in_RSI[3];
  __l._M_len = 4;
  __l._M_array = &local_38;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (&local_50,__l,&local_51);
  PVar2 = ValuesIn<__gnu_cxx::__normal_iterator<unsigned_long_long_const*,std::vector<unsigned_long_long,std::allocator<unsigned_long_long>>>>
                    ((testing *)this,
                     (__normal_iterator<const_unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
                      )local_50.
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                     (__normal_iterator<const_unsigned_long_long_*,_std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>
                      )local_50.
                       super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  _Var1._M_pi = PVar2.impl_.
                super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_long_long>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  if (local_50.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
      super__Vector_impl_data._M_start != (unsigned_long_long *)0x0) {
    operator_delete(local_50.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    _Var1._M_pi = extraout_RDX;
  }
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_long_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = _Var1._M_pi;
  PVar2.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_long_long>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<unsigned_long_long>)
         PVar2.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<unsigned_long_long>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }